

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

SESSION_SEND_TRANSFER_RESULT
session_send_transfer
          (LINK_ENDPOINT_HANDLE link_endpoint,TRANSFER_HANDLE transfer,PAYLOAD *payloads,
          size_t payload_count,delivery_number *delivery_id,ON_SEND_COMPLETE on_send_complete,
          void *callback_context)

{
  SESSION_HANDLE pSVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  AMQP_VALUE pAVar5;
  ulong uVar6;
  PAYLOAD *pPVar7;
  size_t *psVar8;
  uint uVar9;
  size_t sVar10;
  uint uVar11;
  ulong uVar12;
  SESSION_SEND_TRANSFER_RESULT SVar13;
  ulong uVar14;
  ulong uVar15;
  ON_SEND_COMPLETE on_send_complete_00;
  bool bVar16;
  size_t encoded_size;
  uint local_7c;
  ulong local_78;
  uint local_6c;
  ulong local_68;
  AMQP_VALUE local_60;
  ulong local_58;
  ON_SEND_COMPLETE local_50;
  AMQP_VALUE local_48;
  PAYLOAD *local_40;
  int local_38 [2];
  
  if (transfer == (TRANSFER_HANDLE)0x0 || link_endpoint == (LINK_ENDPOINT_HANDLE)0x0) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  pSVar1 = link_endpoint->session;
  if (pSVar1->session_state != SESSION_STATE_MAPPED) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  bVar16 = payload_count != 0;
  if ((payload_count == 0) || (uVar12 = payloads->length, uVar12 >> 0x20 != 0)) {
    bVar2 = false;
  }
  else {
    psVar8 = &payloads[1].length;
    uVar15 = 1;
    uVar6 = 0;
    do {
      uVar14 = uVar12 + uVar6;
      if ((CARRY8(uVar12,uVar6)) ||
         (bVar16 = uVar15 < payload_count, uVar6 = uVar14, uVar15 == payload_count)) break;
      uVar12 = *psVar8;
      psVar8 = psVar8 + 2;
      uVar15 = uVar15 + 1;
    } while (uVar12 >> 0x20 == 0);
    bVar2 = uVar6 >> 0x20 != 0;
  }
  if (bVar16) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  if (bVar2) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  if (pSVar1->remote_incoming_window == 0) {
    return SESSION_SEND_TRANSFER_BUSY;
  }
  *delivery_id = pSVar1->next_outgoing_id;
  local_50 = on_send_complete;
  iVar3 = transfer_set_handle(transfer,link_endpoint->output_handle);
  if (iVar3 != 0) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  iVar3 = transfer_set_delivery_id(transfer,*delivery_id);
  if (iVar3 != 0) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  iVar3 = transfer_set_more(transfer,false);
  if (iVar3 != 0) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  pAVar5 = amqpvalue_create_transfer(transfer);
  if (pAVar5 == (AMQP_VALUE)0x0) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  iVar3 = connection_get_remote_max_frame_size(pSVar1->connection,&local_6c);
  SVar13 = SESSION_SEND_TRANSFER_ERROR;
  if ((iVar3 == 0) && (iVar3 = amqpvalue_get_encoded_size(pAVar5,(size_t *)local_38), iVar3 == 0)) {
    if (payload_count == 0) {
      uVar12 = 0;
    }
    else {
      psVar8 = &payloads->length;
      uVar12 = 0;
      sVar10 = payload_count;
      do {
        uVar12 = uVar12 + *psVar8;
        psVar8 = psVar8 + 2;
        sVar10 = sVar10 - 1;
      } while (sVar10 != 0);
    }
    local_6c = (local_6c - local_38[0]) - 8;
    local_48 = pAVar5;
    if (local_6c < uVar12) {
      local_7c = 0;
      local_78 = 0;
      do {
        if (uVar12 == 0) {
          uVar12 = 0;
          break;
        }
        uVar6 = (ulong)local_6c;
        uVar4 = (uint)uVar12;
        if (local_6c < (uint)uVar12) {
          uVar4 = local_6c;
        }
        local_68 = uVar12;
        iVar3 = transfer_set_more(transfer,uVar6 < uVar12);
        if ((iVar3 == 0) &&
           (local_58 = uVar6, pAVar5 = amqpvalue_create_transfer(transfer), uVar12 = local_78,
           uVar11 = local_7c, uVar9 = uVar4, pAVar5 != (AMQP_VALUE)0x0)) {
          while (uVar9 != 0) {
            pPVar7 = payloads + uVar12;
            uVar15 = pPVar7->length - (ulong)uVar11;
            uVar6 = (ulong)uVar9;
            uVar9 = uVar11 + uVar9;
            uVar12 = uVar12 + (uVar15 < uVar6);
            uVar11 = uVar9;
            if (uVar15 < uVar6) {
              uVar11 = 0;
            }
            uVar9 = uVar9 - (int)pPVar7->length;
            if (uVar6 <= uVar15) {
              uVar9 = 0;
            }
          }
          uVar6 = (uVar12 - local_78) + 1;
          if (uVar6 == 0) {
            uVar6 = 0xffffffffffffffff;
          }
          uVar15 = 0xffffffff;
          if (uVar6 < 0xffffffff) {
            uVar15 = uVar6;
          }
          if ((0xfffffffe < uVar6 || uVar12 < local_78) ||
             (local_60 = pAVar5, pPVar7 = (PAYLOAD *)calloc(1,uVar15 << 4), pAVar5 = local_60,
             pPVar7 == (PAYLOAD *)0x0)) {
            amqpvalue_destroy(pAVar5);
            goto LAB_0015f4f5;
          }
          if (uVar4 == 0) {
            uVar12 = 0;
          }
          else {
            psVar8 = &pPVar7->length;
            uVar12 = 0;
            uVar11 = uVar4;
            do {
              sVar10 = payloads[local_78].length;
              uVar6 = sVar10 - local_7c;
              ((PAYLOAD *)(psVar8 + -1))->bytes = payloads[local_78].bytes + local_7c;
              if (uVar11 < uVar6) {
                *psVar8 = (ulong)uVar11;
                local_7c = local_7c + uVar11;
                uVar11 = 0;
              }
              else {
                *psVar8 = uVar6;
                uVar11 = (uVar11 + local_7c) - (int)sVar10;
                local_78 = local_78 + 1;
                local_7c = 0;
              }
              uVar12 = uVar12 + 1;
            } while ((uVar11 != 0) && (psVar8 = psVar8 + 2, uVar12 < uVar15));
          }
          on_send_complete_00 = local_50;
          if (local_58 < local_68) {
            on_send_complete_00 = (ON_SEND_COMPLETE)0x0;
          }
          local_40 = pPVar7;
          iVar3 = connection_encode_frame
                            (pSVar1->endpoint,local_60,pPVar7,uVar12,on_send_complete_00,
                             callback_context);
          local_58 = CONCAT44(local_58._4_4_,iVar3);
          free(pPVar7);
          amqpvalue_destroy(local_60);
          if ((int)local_58 != 0) goto LAB_0015f4f5;
          bVar16 = true;
          uVar12 = local_68 - uVar4;
        }
        else {
LAB_0015f4f5:
          bVar16 = false;
          uVar12 = local_68;
        }
      } while (bVar16);
      pAVar5 = local_48;
      if (uVar12 != 0) goto LAB_0015f300;
    }
    else {
      iVar3 = connection_encode_frame
                        (pSVar1->endpoint,pAVar5,payloads,payload_count,local_50,callback_context);
      if (iVar3 != 0) goto LAB_0015f300;
    }
    pSVar1->next_outgoing_id = pSVar1->next_outgoing_id + 1;
    pSVar1->remote_incoming_window = pSVar1->remote_incoming_window - 1;
    pSVar1->outgoing_window = pSVar1->outgoing_window - 1;
    SVar13 = SESSION_SEND_TRANSFER_OK;
  }
LAB_0015f300:
  amqpvalue_destroy(pAVar5);
  return SVar13;
}

Assistant:

SESSION_SEND_TRANSFER_RESULT session_send_transfer(LINK_ENDPOINT_HANDLE link_endpoint, TRANSFER_HANDLE transfer, PAYLOAD* payloads, size_t payload_count, delivery_number* delivery_id, ON_SEND_COMPLETE on_send_complete, void* callback_context)
{
    SESSION_SEND_TRANSFER_RESULT result;

    /* Codes_S_R_S_SESSION_01_054: [If link_endpoint or transfer is NULL, session_send_transfer shall fail and return a non-zero value.] */
    if ((link_endpoint == NULL) ||
        (transfer == NULL))
    {
        result = SESSION_SEND_TRANSFER_ERROR;
    }
    else
    {
        LINK_ENDPOINT_INSTANCE* link_endpoint_instance = (LINK_ENDPOINT_INSTANCE*)link_endpoint;
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)link_endpoint_instance->session;

        /* Codes_S_R_S_SESSION_01_059: [When session_send_transfer is called while the session is not in the MAPPED state, session_send_transfer shall fail and return a non-zero value.] */
        if (session_instance->session_state != SESSION_STATE_MAPPED)
        {
            result = SESSION_SEND_TRANSFER_ERROR;
        }
        else
        {
            size_t payload_size = 0;
            size_t i;

            for (i = 0; i < payload_count; i++)
            {
                if ((payloads[i].length > UINT32_MAX) ||
                    (payload_size + payloads[i].length < payload_size))
                {
                    break;
                }

                payload_size += payloads[i].length;
            }

            if ((i < payload_count) ||
                (payload_size > UINT32_MAX))
            {
                result = SESSION_SEND_TRANSFER_ERROR;
            }
            else
            {
                if (session_instance->remote_incoming_window == 0)
                {
                    result = SESSION_SEND_TRANSFER_BUSY;
                }
                else
                {
                    /* Codes_S_R_S_SESSION_01_012: [The session endpoint assigns each outgoing transfer frame an implicit transfer-id from a session scoped sequence.] */
                    /* Codes_S_R_S_SESSION_01_027: [sending a transfer Upon sending a transfer, the sending endpoint will increment its next-outgoing-id] */
                    *delivery_id = session_instance->next_outgoing_id;
                    if ((transfer_set_handle(transfer, link_endpoint_instance->output_handle) != 0) ||
                        (transfer_set_delivery_id(transfer, *delivery_id) != 0) ||
                        (transfer_set_more(transfer, false) != 0))
                    {
                        /* Codes_S_R_S_SESSION_01_058: [When any other error occurs, session_send_transfer shall fail and return a non-zero value.] */
                        result = SESSION_SEND_TRANSFER_ERROR;
                    }
                    else
                    {
                        AMQP_VALUE transfer_value;

                        transfer_value = amqpvalue_create_transfer(transfer);
                        if (transfer_value == NULL)
                        {
                            /* Codes_S_R_S_SESSION_01_058: [When any other error occurs, session_send_transfer shall fail and return a non-zero value.] */
                            result = SESSION_SEND_TRANSFER_ERROR;
                        }
                        else
                        {
                            uint32_t available_frame_size;
                            size_t encoded_size;

                            if ((connection_get_remote_max_frame_size(session_instance->connection, &available_frame_size) != 0) ||
                                (amqpvalue_get_encoded_size(transfer_value, &encoded_size) != 0))
                            {
                                result = SESSION_SEND_TRANSFER_ERROR;
                            }
                            else
                            {
                                payload_size = 0;

                                for (i = 0; i < payload_count; i++)
                                {
                                    payload_size += payloads[i].length;
                                }

                                available_frame_size -= (uint32_t)encoded_size;
                                available_frame_size -= 8;

                                if (available_frame_size >= payload_size)
                                {
                                    /* Codes_S_R_S_SESSION_01_055: [The encoding of the frame shall be done by calling connection_encode_frame and passing as arguments: the connection handle associated with the session, the transfer performative and the payload chunks passed to session_send_transfer.] */
                                    if (connection_encode_frame(session_instance->endpoint, transfer_value, payloads, payload_count, on_send_complete, callback_context) != 0)
                                    {
                                        /* Codes_S_R_S_SESSION_01_056: [If connection_encode_frame fails then session_send_transfer shall fail and return a non-zero value.] */
                                        result = SESSION_SEND_TRANSFER_ERROR;
                                    }
                                    else
                                    {
                                        /* Codes_S_R_S_SESSION_01_018: [is incremented after each successive transfer according to RFC-1982 [RFC1982] serial number arithmetic.] */
                                        session_instance->next_outgoing_id++;
                                        session_instance->remote_incoming_window--;
                                        session_instance->outgoing_window--;

                                        /* Codes_S_R_S_SESSION_01_053: [On success, session_send_transfer shall return 0.] */
                                        result = SESSION_SEND_TRANSFER_OK;
                                    }
                                }
                                else
                                {
                                    size_t current_payload_index = 0;
                                    uint32_t current_payload_pos = 0;

                                    /* break it down into different deliveries */
                                    while (payload_size > 0)
                                    {
                                        uint32_t transfer_frame_payload_count = 0;
                                        uint32_t current_transfer_frame_payload_size = (uint32_t)payload_size;
                                        uint32_t byte_counter;
                                        size_t temp_current_payload_index = current_payload_index;
                                        uint32_t temp_current_payload_pos = current_payload_pos;
                                        AMQP_VALUE multi_transfer_amqp_value;
                                        PAYLOAD* transfer_frame_payloads;
                                        bool more;

                                        if (current_transfer_frame_payload_size > available_frame_size)
                                        {
                                            current_transfer_frame_payload_size = available_frame_size;
                                        }

                                        if (available_frame_size >= payload_size)
                                        {
                                            more = false;
                                        }
                                        else
                                        {
                                            more = true;
                                        }

                                        if (transfer_set_more(transfer, more) != 0)
                                        {
                                            break;
                                        }

                                        multi_transfer_amqp_value = amqpvalue_create_transfer(transfer);
                                        if (multi_transfer_amqp_value == NULL)
                                        {
                                            break;
                                        }

                                        byte_counter = current_transfer_frame_payload_size;
                                        while (byte_counter > 0)
                                        {
                                            if (payloads[temp_current_payload_index].length - temp_current_payload_pos >= byte_counter)
                                            {
                                                /* more data than we need */
                                                temp_current_payload_pos += byte_counter;
                                                byte_counter = 0;
                                            }
                                            else
                                            {
                                                byte_counter -= (uint32_t)payloads[temp_current_payload_index].length - temp_current_payload_pos;
                                                temp_current_payload_index++;
                                                temp_current_payload_pos = 0;
                                            }
                                        }

                                        //transfer_frame_payload_len = (uint32_t)(temp_current_payload_index - current_payload_index + 1); // use safe int
                                        size_t payload_len = safe_subtract_size_t(temp_current_payload_index, current_payload_index);
                                        payload_len = safe_add_size_t(payload_len, 1);
                                        uint32_t transfer_frame_payload_len = payload_len < UINT32_MAX ? (uint32_t)payload_len : UINT32_MAX;

                                        if (transfer_frame_payload_len == UINT32_MAX ||
                                           (transfer_frame_payloads = (PAYLOAD*)calloc(1, (transfer_frame_payload_len * sizeof(PAYLOAD)))) == NULL)
                                        {
                                            amqpvalue_destroy(multi_transfer_amqp_value);
                                            break;
                                        }

                                        /* copy data */
                                        byte_counter = current_transfer_frame_payload_size;
                                        transfer_frame_payload_count = 0;

                                        while (byte_counter > 0 && transfer_frame_payload_count < transfer_frame_payload_len)
                                        {
                                            if (payloads[current_payload_index].length - current_payload_pos > byte_counter)
                                            {
                                                /* more data than we need */
                                                transfer_frame_payloads[transfer_frame_payload_count].bytes = payloads[current_payload_index].bytes + current_payload_pos;
                                                transfer_frame_payloads[transfer_frame_payload_count].length = byte_counter;
                                                current_payload_pos += byte_counter;
                                                byte_counter = 0;
                                            }
                                            else
                                            {
                                                /* copy entire payload and move to the next */
                                                transfer_frame_payloads[transfer_frame_payload_count].bytes = payloads[current_payload_index].bytes + current_payload_pos;
                                                transfer_frame_payloads[transfer_frame_payload_count].length = payloads[current_payload_index].length - current_payload_pos;
                                                byte_counter -= (uint32_t)payloads[current_payload_index].length - current_payload_pos;
                                                current_payload_index++;
                                                current_payload_pos = 0;
                                            }

                                            transfer_frame_payload_count++;
                                        }

                                        if (connection_encode_frame(session_instance->endpoint, multi_transfer_amqp_value, transfer_frame_payloads, transfer_frame_payload_count,
                                            /* only fire the send complete calllback on the last frame of the multi frame transfer */
                                            more ? NULL : on_send_complete,
                                            callback_context) != 0)
                                        {
                                            free(transfer_frame_payloads);
                                            amqpvalue_destroy(multi_transfer_amqp_value);
                                            break;
                                        }

                                        free(transfer_frame_payloads);
                                        amqpvalue_destroy(multi_transfer_amqp_value);
                                        payload_size -= current_transfer_frame_payload_size;
                                    }

                                    if (payload_size > 0)
                                    {
                                        result = SESSION_SEND_TRANSFER_ERROR;
                                    }
                                    else
                                    {
                                        /* Codes_S_R_S_SESSION_01_018: [is incremented after each successive transfer according to RFC-1982 [RFC1982] serial number arithmetic.] */
                                        session_instance->next_outgoing_id++;
                                        session_instance->remote_incoming_window--;
                                        session_instance->outgoing_window--;

                                        result = SESSION_SEND_TRANSFER_OK;
                                    }
                                }
                            }

                            amqpvalue_destroy(transfer_value);
                        }
                    }
                }
            }
        }
    }

    return result;
}